

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::RegularExpression::matchChar
          (RegularExpression *this,Context *context,XMLInt32 ch,XMLSize_t *offset,bool ignoreCase)

{
  bool bVar1;
  XMLInt32 strCh;
  XMLInt32 local_1c;
  
  if (*offset < context->fLimit) {
    local_1c = 0;
    bVar1 = Context::nextCh(context,&local_1c,offset);
    if (bVar1) {
      if (ignoreCase) {
        bVar1 = matchIgnoreCase((RegularExpression *)context,ch,local_1c);
      }
      else {
        bVar1 = local_1c == ch;
      }
      if (bVar1 != false) {
        *offset = *offset + 1;
      }
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool RegularExpression::matchChar(Context* const context,
                                  const XMLInt32 ch, XMLSize_t& offset,
                                  const bool ignoreCase) const
{
    if (offset >= context->fLimit)
        return false;

    XMLInt32 strCh = 0;

    if (!context->nextCh(strCh, offset))
        return false;

    bool match = ignoreCase ? matchIgnoreCase(ch, strCh)
                            : (ch == strCh);
    if (!match)
        return false;

    ++offset;

    return true;
}